

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode Curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret,_Bool *gotsocket)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  CURLMcode CVar4;
  long lVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong uVar7;
  ulong extraout_RDX_00;
  ulong uVar8;
  Curl_easy *data;
  uint uVar9;
  int iVar10;
  Curl_easy *data_00;
  ushort uVar11;
  pollfd *ufds;
  int iVar12;
  undefined1 auVar13 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  pollfd a_few_on_stack [10];
  
  uVar7 = (ulong)extra_nfds;
  if (gotsocket != (_Bool *)0x0) {
    *gotsocket = false;
  }
  CVar4 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    if (multi->in_callback == false) {
      data = (Curl_easy *)&multi->easyp;
      iVar12 = 0;
      data_00 = data;
LAB_0012861d:
      data_00 = data_00->next;
      if (data_00 != (Curl_easy *)0x0) {
        uVar1 = multi_getsock(data_00,sockbunch,(int)uVar7);
        lVar5 = 0;
        uVar7 = extraout_RDX;
        do {
          if (lVar5 == 5) break;
          if ((uVar1 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
            uVar7 = 0xffffffff;
          }
          else {
            iVar12 = iVar12 + 1;
            uVar7 = (ulong)(uint)sockbunch[lVar5];
          }
          if (((uVar1 >> ((byte)lVar5 & 0x1f)) >> 0x10 & 1) != 0) {
            iVar12 = iVar12 + 1;
            uVar7 = (ulong)(uint)sockbunch[lVar5];
          }
          lVar5 = lVar5 + 1;
        } while ((int)uVar7 != -1);
        goto LAB_0012861d;
      }
      multi_timeout(multi,&timeout_internal);
      uVar7 = (ulong)(uint)timeout_ms;
      if (timeout_internal < timeout_ms) {
        uVar7 = timeout_internal & 0xffffffff;
      }
      if (timeout_internal < 0) {
        uVar7 = (ulong)(uint)timeout_ms;
      }
      uVar1 = iVar12 + extra_nfds;
      if (uVar1 < 0xb) {
        auVar13._8_8_ = uVar7;
        auVar13._0_8_ = a_few_on_stack;
      }
      else {
        auVar13 = (undefined1  [16])(*Curl_cmalloc)((ulong)uVar1 << 3);
        if (auVar13._0_8_ == 0) {
          return CURLM_OUT_OF_MEMORY;
        }
      }
      uVar6 = auVar13._8_8_;
      ufds = auVar13._0_8_;
      uVar9 = 0;
      if (iVar12 != 0) {
LAB_001286d0:
        data = data->next;
        if (data != (Curl_easy *)0x0) {
          uVar2 = multi_getsock(data,sockbunch,(int)uVar6);
          lVar5 = 0;
          uVar6 = extraout_RDX_00;
          do {
            if (lVar5 == 5) break;
            if ((uVar2 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
              uVar6 = 0xffffffff;
            }
            else {
              uVar6 = (ulong)(uint)sockbunch[lVar5];
              ufds[uVar9].fd = sockbunch[lVar5];
              ufds[uVar9].events = 1;
              uVar9 = uVar9 + 1;
            }
            if (((uVar2 >> ((byte)lVar5 & 0x1f)) >> 0x10 & 1) != 0) {
              uVar6 = (ulong)(uint)sockbunch[lVar5];
              ufds[uVar9].fd = sockbunch[lVar5];
              ufds[uVar9].events = 4;
              uVar9 = uVar9 + 1;
            }
            lVar5 = lVar5 + 1;
          } while ((int)uVar6 != -1);
          goto LAB_001286d0;
        }
      }
      uVar6 = 0;
      while( true ) {
        uVar2 = (uint)(uVar9 + uVar6);
        if (extra_nfds == uVar6) break;
        uVar8 = uVar9 + uVar6 & 0xffffffff;
        ufds[uVar8].fd = extra_fds[uVar6].fd;
        uVar11 = extra_fds[uVar6].events & 1;
        ufds[uVar8].events = uVar11;
        if ((extra_fds[uVar6].events & 6U) != 0) {
          ufds[uVar8].events = uVar11 | extra_fds[uVar6].events & 6U;
        }
        uVar6 = uVar6 + 1;
      }
      iVar10 = 0;
      if ((uVar2 != 0) && (iVar3 = Curl_poll(ufds,uVar2,(int)uVar7), 0 < iVar3)) {
        for (uVar7 = 0; iVar10 = iVar3, extra_nfds != uVar7; uVar7 = uVar7 + 1) {
          extra_fds[uVar7].revents = ufds[(uint)(iVar12 + (int)uVar7)].revents & 7;
        }
      }
      if (10 < uVar1) {
        (*Curl_cfree)(ufds);
      }
      if (ret != (int *)0x0) {
        *ret = iVar10;
      }
      CVar4 = CURLM_OK;
      if ((gotsocket != (_Bool *)0x0) && (extra_fds != (curl_waitfd *)0x0 || iVar12 != 0)) {
        *gotsocket = true;
      }
    }
    else {
      CVar4 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar4;
}

Assistant:

CURLMcode Curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret,
                          bool *gotsocket) /* if any socket was checked */
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  bool ufds_malloc = FALSE;
  long timeout_internal;
  int retcode = 0;
  struct pollfd a_few_on_stack[NUM_POLLS_ON_STACK];
  struct pollfd *ufds = &a_few_on_stack[0];

  if(gotsocket)
    *gotsocket = FALSE;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  /* Count up how many fds we have from the multi handle */
  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds > NUM_POLLS_ON_STACK) {
    /* 'nfds' is a 32 bit value and 'struct pollfd' is typically 8 bytes
       big, so at 2^29 sockets this value might wrap. When a process gets
       the capability to actually handle over 500 million sockets this
       calculation needs a integer overflow check. */
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
    ufds_malloc = TRUE;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data = multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  if(ufds_malloc)
    free(ufds);
  if(ret)
    *ret = retcode;
  if(gotsocket && (extra_fds || curlfds))
    /* if any socket was checked */
    *gotsocket = TRUE;

  return CURLM_OK;
}